

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::HasHasbitTest_TestHasHasbitExplicitPresence_Test::
~HasHasbitTest_TestHasHasbitExplicitPresence_Test
          (HasHasbitTest_TestHasHasbitExplicitPresence_Test *this)

{
  ~HasHasbitTest_TestHasHasbitExplicitPresence_Test
            ((HasHasbitTest_TestHasHasbitExplicitPresence_Test *)
             ((long)&this[-1].super_HasHasbitTest.foo_proto_.field_0 + 0xe0));
  return;
}

Assistant:

TEST_P(HasHasbitTest, TestHasHasbitExplicitPresence) {
  EXPECT_EQ(GetField()->has_presence(),
            GetParam().expected_output.expected_has_presence);
  EXPECT_EQ(GetFieldHasbitMode(GetField()),
            GetParam().expected_output.expected_hasbitmode);
  EXPECT_EQ(HasHasbit(GetField()),
            GetParam().expected_output.expected_has_hasbit);
}